

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O2

double __thiscall
ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively<false>
          (ValueFunctionDecPOMDPDiscrete *this,Index sI,Index johI,Index stage)

{
  DecPOMDPDiscreteInterface *pDVar1;
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  int iVar3;
  Index IVar4;
  Index sucSI;
  ulong uVar5;
  Index joI;
  uint joI_00;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double local_58;
  undefined1 extraout_var [56];
  
  iVar3 = (*(this->_m_jpol->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x11])
                    (this->_m_jpol,(ulong)johI);
  pDVar1 = this->_m_pu->_m_DecPOMDP;
  dVar6 = (double)(**(code **)(*(long *)pDVar1 + 0xc0))(pDVar1,sI,iVar3);
  IVar4 = PlanningUnitMADPDiscrete::GetTimeStepForJOHI
                    (&this->_m_pu->super_PlanningUnitMADPDiscrete,johI);
  if ((ulong)IVar4 < this->_m_h - 1) {
    local_58 = 0.0;
    for (uVar5 = 0; uVar5 < this->_m_nrS; uVar5 = (ulong)((Index)uVar5 + 1)) {
      pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
      dVar7 = (double)(**(code **)((long)*pMVar2 + 0x108))(pMVar2,sI,iVar3,uVar5);
      joI_00 = 0;
      while ((ulong)joI_00 < this->_m_nrJO) {
        pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
        dVar8 = (double)(**(code **)((long)*pMVar2 + 0x118))(pMVar2,iVar3,uVar5,joI_00);
        IVar4 = PlanningUnitMADPDiscrete::GetSuccessorJOHI
                          (&this->_m_pu->super_PlanningUnitMADPDiscrete,johI,joI_00);
        auVar9._0_8_ = CalculateVsjohRecursively<false>(this,(Index)uVar5,IVar4,stage + 1);
        auVar9._8_56_ = extraout_var;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_58;
        joI_00 = joI_00 + 1;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = dVar8 * dVar7;
        auVar10 = vfmadd231sd_fma(auVar11,auVar9._0_16_,auVar10);
        local_58 = auVar10._0_8_;
      }
    }
    dVar6 = dVar6 + local_58;
  }
  return dVar6;
}

Assistant:

double ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively(Index sI,Index johI, Index stage)
{
#if DEBUG_CALCV
    std::cout<< "\nValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively("
             << sI << ", " << johI << ") called"<<std::endl;
#endif

    Index jaI = GetJPol()->GetJointActionIndex(johI);
    double R = _m_pu->GetReward(sI, jaI);
    double ExpFutureR = 0.0;
    // horizon h policy makes decision on observation histories which 
    // maximally have length h-1. 
    // t=0 - () - length=0 
    // ... 
    // t=h-1 - (o1,...,o{h-1}) - length h-1
    if( ( CACHED && stage >= _m_h - 1) ||
        (!CACHED && _m_pu->GetTimeStepForJOHI(johI) >= _m_h - 1 ) )
    {
#if DEBUG_CALCV
        std::cout << "ValueFunctionDecPOMDPDiscrete::CalculateVsjoh"
                  << "Recursively("<< sI <<", " << johI << ") - V="<<R<<std::endl;
#endif
        return(R);
    }

#if DEBUG_CALCV
    std::cout << "Calculating future reward"<<std::endl;
#endif
    for(Index sucSI = 0; sucSI < _m_nrS; sucSI++)
    {
        double probSucSI = _m_pu->GetTransitionProbability(sI, jaI,sucSI);
#if DEBUG_CALCV
        std::cout << "P(s"<<sucSI<<"|s"<<sI<<",ja"<<jaI<<")="<<probSucSI<<std::endl;
#endif

        for(Index joI = 0; joI < _m_nrJO; joI++)
        {
            double probJOI =  _m_pu->GetObservationProbability(jaI, sucSI, joI);
#if DEBUG_CALCV
            std::cout << "P(jo"<<joI<<"|ja"<<jaI<<",s"<<sucSI<<")="<<probJOI<<std::endl;
#endif
            Index sucJohI = _m_pu->GetSuccessorJOHI(johI, joI);

            double thisSucV;
            bool valid=false;
            if (CACHED)
                thisSucV=GetCached(sucSI,sucJohI,valid); // read from cache
            if (!valid) // if not found in cache or cache is not used
                thisSucV=CalculateVsjohRecursively<CACHED>(sucSI,sucJohI,stage+1);
            ExpFutureR += probSucSI * probJOI * thisSucV;
        }//end for each observation
    }//end for each potential succesor state
    double val = R + ExpFutureR;
    if (CACHED)
        SetCached(sI, johI, val); // write to cache
#if DEBUG_CALCV
    std::cout << "ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively("
              << sI <<", " << johI << ") \n->immediate R="<<R
              << " \n->exp. future reward="<<ExpFutureR<<"\n->V="<<val<<std::endl;
#endif
    return(val);
}